

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O1

bool __thiscall QTextBoundaryFinder::isAtBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  bool bVar3;
  
  pQVar1 = this->attributes;
  if (pQVar1 == (QCharAttributes *)0x0) {
switchD_00344592_default:
    return false;
  }
  lVar2 = this->pos;
  bVar3 = false;
  if ((-1 < lVar2) && (bVar3 = false, lVar2 <= (this->sv).m_size)) {
    switch(this->t) {
    case Grapheme:
      bVar3 = (bool)((byte)pQVar1[lVar2] & 1);
      break;
    case Word:
      return (bool)(((byte)pQVar1[lVar2] & 2) >> 1);
    case Sentence:
      return (bool)(((byte)pQVar1[lVar2] & 4) >> 2);
    case Line:
      return (bool)(lVar2 == 0 | ((byte)pQVar1[lVar2] & 8) >> 3);
    default:
      goto switchD_00344592_default;
    }
  }
  return bVar3;
}

Assistant:

bool QTextBoundaryFinder::isAtBoundary() const
{
    if (!attributes || pos < 0 || pos > sv.size())
        return false;

    switch(t) {
    case Grapheme:
        return attributes[pos].graphemeBoundary;
    case Word:
        return attributes[pos].wordBreak;
    case Sentence:
        return attributes[pos].sentenceBoundary;
    case Line:
        // ### TR#14 LB2 prohibits break at sot
        return attributes[pos].lineBreak || pos == 0;
    }
    return false;
}